

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

int sys_trim(mstate m,size_t pad)

{
  int iVar1;
  ulong uVar2;
  msegmentptr pmVar3;
  size_t sVar4;
  void *pvVar5;
  msegmentptr sp;
  mstate pmVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ulong __len;
  ulong uVar7;
  mstate m_00;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar4 = mparams.granularity;
  if ((mstate)0xffffffffffffff7f < m) {
    return 0;
  }
  if (_gm_.top == (mchunkptr)0x0) {
    return 0;
  }
  m_00 = (mstate)_gm_.top;
  if (m->smallbins + 1 < _gm_.topsize) {
    uVar2 = (((_gm_.topsize - (long)m) + mparams.granularity) - 0x51) / mparams.granularity;
    pmVar3 = segment_holding((mstate)_gm_.top,(char *)pad);
    uVar7 = 0;
    if ((pmVar3->sflags & 9) != 1) goto LAB_00105de0;
    __len = (uVar2 - 1) * sVar4;
    uVar2 = pmVar3->size;
    if (__len <= uVar2) {
      m_00 = (mstate)pmVar3->base;
      pmVar6 = (mstate)&_gm_.seg;
      do {
        uVar7 = 0;
        if (m_00 <= pmVar6 && pmVar6 < (mstate)((long)m_00->smallbins + (uVar2 - 0x48)))
        goto LAB_00105de0;
        pmVar6 = (mstate)pmVar6->topsize;
      } while (pmVar6 != (mstate)0x0);
      pvVar5 = mremap(m_00,uVar2,uVar2 - __len,0);
      if (pvVar5 == (void *)0xffffffffffffffff) {
        m_00 = (mstate)(pmVar3->base + (uVar2 - __len));
        iVar1 = munmap(m_00,__len);
        uVar7 = 0;
        if ((__len == 0) || (sVar4 = extraout_RDX_00, iVar1 != 0)) goto LAB_00105de0;
      }
      else {
        sVar4 = extraout_RDX;
        if (__len == 0) goto LAB_00105ddd;
      }
      pmVar3->size = pmVar3->size - __len;
      _gm_.footprint = _gm_.footprint - __len;
      m_00 = (mstate)_gm_.top;
      init_top((mstate)_gm_.top,(mchunkptr)(_gm_.topsize - __len),sVar4);
      uVar7 = __len;
      goto LAB_00105de0;
    }
  }
LAB_00105ddd:
  uVar7 = 0;
LAB_00105de0:
  sVar4 = release_unused_segments(m_00);
  if (sVar4 + uVar7 == 0) {
    iVar1 = 0;
    if (_gm_.trim_check < _gm_.topsize) {
      _gm_.trim_check = 0xffffffffffffffff;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}